

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

ggml_tensor * __thiscall
llama_model_loader::check_tensor_dims
          (llama_model_loader *this,string *name,vector<long,_std::allocator<long>_> *ne,
          bool required)

{
  pointer plVar1;
  pointer pcVar2;
  llama_tensor_weight *plVar3;
  runtime_error *prVar4;
  ulong uVar5;
  ulong uVar6;
  ggml_tensor *t;
  string sStack_88;
  string local_68;
  string local_48;
  
  plVar3 = get_weight(this,(name->_M_dataplus)._M_p);
  if (plVar3 == (llama_tensor_weight *)0x0) {
    t = (ggml_tensor *)0x0;
  }
  else {
    t = plVar3->tensor;
  }
  if (t == (ggml_tensor *)0x0) {
    if (required) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_88,"%s: tensor \'%s\' not found","check_tensor_dims",
                        (name->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar4,(string *)&sStack_88);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    t = (ggml_tensor *)0x0;
  }
  else {
    plVar1 = (ne->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar5 = (long)(ne->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)plVar1 >> 3;
    uVar6 = 0;
    do {
      if (uVar6 < uVar5) {
        if (plVar1[uVar6] != t->ne[uVar6]) goto LAB_001b6136;
        if (uVar5 <= uVar6) goto LAB_001b6108;
      }
      else {
LAB_001b6108:
        if (t->ne[uVar6] != 1) {
LAB_001b6136:
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          pcVar2 = (name->_M_dataplus)._M_p;
          llama_format_tensor_shape_abi_cxx11_(&local_48,ne);
          llama_format_tensor_shape_abi_cxx11_(&local_68,t);
          format_abi_cxx11_(&sStack_88,"%s: tensor \'%s\' has wrong shape; expected %s, got %s",
                            "check_tensor_dims",pcVar2,local_48._M_dataplus._M_p,
                            local_68._M_dataplus._M_p);
          std::runtime_error::runtime_error(prVar4,(string *)&sStack_88);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
  }
  return t;
}

Assistant:

const struct ggml_tensor * llama_model_loader::check_tensor_dims(const std::string & name, const std::vector<int64_t> & ne, bool required) const {
    const struct ggml_tensor * cur = get_tensor_meta(name.c_str());

    if (cur == NULL) {
        if (!required) {
            return NULL;
        }
        throw std::runtime_error(format("%s: tensor '%s' not found", __func__, name.c_str()));
    }

    {
        bool is_ok = true;
        for (size_t i = 0; i < GGML_MAX_DIMS; ++i) {
            if ((i < ne.size() && ne[i] != cur->ne[i]) || (i >= ne.size() && cur->ne[i] != 1)) {
                is_ok = false;
                break;
            }
        }
        if (!is_ok) {
            throw std::runtime_error(
                    format("%s: tensor '%s' has wrong shape; expected %s, got %s",
                        __func__, name.c_str(),
                        llama_format_tensor_shape(ne).c_str(),
                        llama_format_tensor_shape(cur).c_str()));
        }
    }

    return cur;
}